

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outchars.c
# Opt level: O2

void init_displaychars(void)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  curses_drawing_info *pcVar4;
  nh_bool nVar5;
  int iVar6;
  nh_drawing_info *orig;
  size_t sVar7;
  __off_t _Var8;
  char *pcVar9;
  char *pcVar10;
  ushort **ppuVar11;
  wchar_t *pwVar12;
  byte *pbVar13;
  ulong uVar14;
  ulong uVar15;
  byte *pbVar16;
  ulong uVar17;
  curses_symdef_conflict local_1a0;
  char local_178 [64];
  char local_138 [5];
  undefined8 auStack_133 [32];
  
  orig = (nh_drawing_info *)nh_get_drawing_info();
  default_drawing = load_nh_drawing_info(orig);
  unicode_drawing = load_nh_drawing_info(orig);
  rogue_drawing = load_nh_drawing_info(orig);
  uVar17 = 0;
  apply_override(unicode_drawing,unicode_graphics_ovr,L'*','\0');
  apply_override(rogue_drawing,rogue_graphics_ovr,L'\n','\0');
  local_138[0] = '\0';
  nVar5 = get_gamedir(CONFIG_DIR,local_138);
  if (nVar5 != '\0') {
    sVar7 = strlen(local_138);
    builtin_strncpy(local_138 + sVar7,"unicode.",8);
    *(undefined8 *)((long)auStack_133 + sVar7) = 0x666e6f632e6564;
    iVar6 = open(local_138,0,0);
    if (iVar6 != -1) {
      _Var8 = lseek(iVar6,0,2);
      lseek(iVar6,0,0);
      iVar3 = (int)_Var8;
      pcVar9 = (char *)malloc((long)(iVar3 + 1));
      read(iVar6,pcVar9,(long)iVar3);
      pcVar9[iVar3] = '\0';
      close(iVar6);
      pcVar10 = strtok(pcVar9,"\r\n");
      while (pcVar10 != (char *)0x0) {
        if ((*pcVar10 == '!') && (pcVar10[1] == '\"')) {
          local_1a0.unichar[3] = L'\0';
          local_1a0.unichar[4] = L'\0';
          local_1a0.unichar[5] = L'\0';
          local_1a0.ch = 0;
          local_1a0.custom = '\0';
          local_1a0._39_1_ = 0;
          local_1a0.color = 0;
          local_1a0.unichar[0] = L'\0';
          local_1a0.unichar[1] = L'\0';
          local_1a0.unichar[2] = L'\0';
          pbVar16 = (byte *)(pcVar10 + 3);
          for (sVar7 = 0; (cVar1 = (pcVar10 + 2)[sVar7], cVar1 != '\0' && (cVar1 != '\"'));
              sVar7 = sVar7 + 1) {
            pbVar16 = pbVar16 + 1;
          }
          strncpy(local_178,pcVar10 + 2,sVar7);
          local_178[sVar7] = '\0';
          local_1a0.symname = local_178;
          do {
            pbVar13 = pbVar16;
            bVar2 = *pbVar13;
            if ((ulong)bVar2 == 0) break;
            ppuVar11 = __ctype_b_loc();
            pbVar16 = pbVar13 + 1;
          } while ((*(byte *)((long)*ppuVar11 + (ulong)bVar2 * 2 + 1) & 0x20) != 0);
          __isoc99_sscanf(pbVar13,"%d",&local_1a0.color);
          for (; bVar2 = *pbVar13, (ulong)bVar2 != 0; pbVar13 = pbVar13 + 1) {
            ppuVar11 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar11 + (ulong)bVar2 * 2 + 1) & 0x20) != 0) break;
          }
          __isoc99_sscanf(pbVar13,"%x",local_1a0.unichar);
          apply_override(unicode_drawing,&local_1a0,L'\x01','\x01');
        }
        pcVar10 = strtok((char *)0x0,"\r\n");
      }
      free(pcVar9);
    }
  }
  pcVar4 = default_drawing;
  cur_drawing = default_drawing;
  uVar15 = (ulong)(uint)default_drawing->num_bgelements;
  if (default_drawing->num_bgelements < L'\x01') {
    uVar15 = uVar17;
  }
  for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    pcVar9 = *(char **)((long)pcVar4->bgelements->unichar + (uVar17 - 0xc));
    iVar6 = strcmp("altar",pcVar9);
    pwVar12 = &altar_id;
    if (iVar6 == 0) {
LAB_00111b6a:
      *pwVar12 = (wchar_t)uVar14;
    }
    else {
      iVar6 = strcmp("vwall",pcVar9);
      pwVar12 = &vwall_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("trwall",pcVar9);
      pwVar12 = &trwall_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("room",pcVar9);
      pwVar12 = &room_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("darkroom",pcVar9);
      pwVar12 = &darkroom_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("ndoor",pcVar9);
      pwVar12 = &ndoor_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("vcdoor",pcVar9);
      pwVar12 = &vcdoor_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("hcdoor",pcVar9);
      pwVar12 = &hcdoor_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("upstair",pcVar9);
      pwVar12 = &upstair_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("upladder",pcVar9);
      pwVar12 = &upladder_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("upsstair",pcVar9);
      pwVar12 = &upsstair_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("dnstair",pcVar9);
      pwVar12 = &dnstair_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("dnladder",pcVar9);
      pwVar12 = &dnladder_id;
      if (iVar6 == 0) goto LAB_00111b6a;
      iVar6 = strcmp("dnsstair",pcVar9);
      pwVar12 = &dnsstair_id;
      if (iVar6 == 0) goto LAB_00111b6a;
    }
    uVar17 = uVar17 + 0x28;
  }
  uVar15 = 0;
  uVar17 = (ulong)(uint)pcVar4->num_traps;
  if (pcVar4->num_traps < L'\x01') {
    uVar17 = uVar15;
  }
  uVar14 = 0;
  do {
    if (uVar17 == uVar14) {
      uVar15 = 0;
      uVar17 = (ulong)(uint)pcVar4->num_objects;
      if (pcVar4->num_objects < L'\x01') {
        uVar17 = uVar15;
      }
      for (uVar14 = 0; uVar17 != uVar14; uVar14 = uVar14 + 1) {
        iVar6 = strcmp("corpse",*(char **)((long)pcVar4->objects->unichar + (uVar15 - 0xc)));
        if (iVar6 == 0) {
          corpse_id = (wchar_t)uVar14;
        }
        uVar15 = uVar15 + 0x28;
      }
      switch_graphics(settings.graphics);
      return;
    }
    pcVar9 = *(char **)((long)pcVar4->traps->unichar + (uVar15 - 0xc));
    iVar6 = strcmp("magic portal",pcVar9);
    pwVar12 = &mportal_id;
    if (iVar6 == 0) {
LAB_00111bcd:
      *pwVar12 = (wchar_t)uVar14;
    }
    else {
      iVar6 = strcmp("vibrating square",pcVar9);
      pwVar12 = &vibsquare_id;
      if (iVar6 == 0) goto LAB_00111bcd;
    }
    uVar14 = uVar14 + 1;
    uVar15 = uVar15 + 0x28;
  } while( true );
}

Assistant:

void init_displaychars(void)
{
    int i;
    struct nh_drawing_info *dinfo = nh_get_drawing_info();
    
    default_drawing = load_nh_drawing_info(dinfo);
    unicode_drawing = load_nh_drawing_info(dinfo);
    rogue_drawing = load_nh_drawing_info(dinfo);
    
    apply_override(unicode_drawing, unicode_graphics_ovr,
		   array_size(unicode_graphics_ovr), FALSE);
    apply_override(rogue_drawing, rogue_graphics_ovr, array_size(rogue_graphics_ovr), FALSE);
    
    read_unisym_config();
    
    cur_drawing = default_drawing;

    /* find bg elements that could use special treatment */
    for (i = 0; i < cur_drawing->num_bgelements; i++) {
	if (!strcmp("altar", cur_drawing->bgelements[i].symname))
	    altar_id = i;
	else if (!strcmp("vwall", cur_drawing->bgelements[i].symname))
	    vwall_id = i;
	else if (!strcmp("trwall", cur_drawing->bgelements[i].symname))
	    trwall_id = i;
	else if (!strcmp("room", cur_drawing->bgelements[i].symname))
	    room_id = i;
	else if (!strcmp("darkroom", cur_drawing->bgelements[i].symname))
	    darkroom_id = i;
	else if (!strcmp("ndoor", cur_drawing->bgelements[i].symname))
	    ndoor_id = i;
	else if (!strcmp("vcdoor", cur_drawing->bgelements[i].symname))
	    vcdoor_id = i;
	else if (!strcmp("hcdoor", cur_drawing->bgelements[i].symname))
	    hcdoor_id = i;
	else if (!strcmp("upstair", cur_drawing->bgelements[i].symname))
	    upstair_id = i;
	else if (!strcmp("upladder", cur_drawing->bgelements[i].symname))
	    upladder_id = i;
	else if (!strcmp("upsstair", cur_drawing->bgelements[i].symname))
	    upsstair_id = i;
	else if (!strcmp("dnstair", cur_drawing->bgelements[i].symname))
	    dnstair_id = i;
	else if (!strcmp("dnladder", cur_drawing->bgelements[i].symname))
	    dnladder_id = i;
	else if (!strcmp("dnsstair", cur_drawing->bgelements[i].symname))
	    dnsstair_id = i;
    }

    /* find traps that could use special treatment */
    for (i = 0; i < cur_drawing->num_traps; i++) {
	if (!strcmp("magic portal", cur_drawing->traps[i].symname))
	    mportal_id = i;
	else if (!strcmp("vibrating square", cur_drawing->traps[i].symname))
	    vibsquare_id = i;
    }

    /* find objects that could use special treatment */
    for (i = 0; i < cur_drawing->num_objects; i++) {
	if (!strcmp("corpse", cur_drawing->objects[i].symname))
	    corpse_id = i;
    }

    /* options are parsed before display is initialized, so redo switch */
    switch_graphics(settings.graphics);
}